

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

xmlSchemaWhitespaceValueType xmlSchemaGetWhiteSpaceFacetValue(xmlSchemaTypePtr type)

{
  int iVar1;
  uint uVar2;
  xmlSchemaWhitespaceValueType xVar3;
  
  if (type->type == XML_SCHEMA_TYPE_BASIC) {
    iVar1 = type->builtInType;
    xVar3 = XML_SCHEMA_WHITESPACE_PRESERVE;
    if ((iVar1 != 1) && (iVar1 != 0x2e)) {
      if (iVar1 == 2) {
        return XML_SCHEMA_WHITESPACE_REPLACE;
      }
      return XML_SCHEMA_WHITESPACE_COLLAPSE;
    }
  }
  else {
    uVar2 = type->flags;
    xVar3 = XML_SCHEMA_WHITESPACE_COLLAPSE;
    if (((((uVar2 & 0x40) == 0) && (xVar3 = XML_SCHEMA_WHITESPACE_UNKNOWN, -1 < (char)uVar2)) &&
        (xVar3 = ~XML_SCHEMA_WHITESPACE_UNKNOWN, (uVar2 >> 8 & 1) != 0)) &&
       (xVar3 = XML_SCHEMA_WHITESPACE_PRESERVE, (uVar2 >> 0x18 & 1) == 0)) {
      xVar3 = XML_SCHEMA_WHITESPACE_COLLAPSE - ((uVar2 >> 0x19 & 1) != 0);
    }
  }
  return xVar3;
}

Assistant:

static xmlSchemaWhitespaceValueType
xmlSchemaGetWhiteSpaceFacetValue(xmlSchemaTypePtr type)
{
    /*
    * The normalization type can be changed only for types which are derived
    * from xsd:string.
    */
    if (type->type == XML_SCHEMA_TYPE_BASIC) {
	/*
	* Note that we assume a whitespace of preserve for anySimpleType.
	*/
	if ((type->builtInType == XML_SCHEMAS_STRING) ||
	    (type->builtInType == XML_SCHEMAS_ANYSIMPLETYPE))
	    return(XML_SCHEMA_WHITESPACE_PRESERVE);
	else if (type->builtInType == XML_SCHEMAS_NORMSTRING)
	    return(XML_SCHEMA_WHITESPACE_REPLACE);
	else {
	    /*
	    * For all `atomic` datatypes other than string (and types `derived`
	    * by `restriction` from it) the value of whiteSpace is fixed to
	    * collapse
	    * Note that this includes built-in list datatypes.
	    */
	    return(XML_SCHEMA_WHITESPACE_COLLAPSE);
	}
    } else if (WXS_IS_LIST(type)) {
	/*
	* For list types the facet "whiteSpace" is fixed to "collapse".
	*/
	return (XML_SCHEMA_WHITESPACE_COLLAPSE);
    } else if (WXS_IS_UNION(type)) {
	return (XML_SCHEMA_WHITESPACE_UNKNOWN);
    } else if (WXS_IS_ATOMIC(type)) {
	if (type->flags & XML_SCHEMAS_TYPE_WHITESPACE_PRESERVE)
	    return (XML_SCHEMA_WHITESPACE_PRESERVE);
	else if (type->flags & XML_SCHEMAS_TYPE_WHITESPACE_REPLACE)
	    return (XML_SCHEMA_WHITESPACE_REPLACE);
	else
	    return (XML_SCHEMA_WHITESPACE_COLLAPSE);
    }
    return (-1);
}